

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMD(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Index IVar2;
  Type local_48;
  Type local_40;
  TranslateToFuzzReader *local_38;
  BasicType local_2c;
  TranslateToFuzzReader *local_28;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = FeatureSet::hasSIMD(&this->wasm->features);
  if (bVar1) {
    bVar1 = Type::isRef((Type *)&this_local);
    if (bVar1) {
      local_28 = this_local;
      type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
    }
    else {
      local_2c = v128;
      bVar1 = Type::operator!=((Type *)&this_local,&local_2c);
      if (bVar1) {
        local_38 = this_local;
        type_local.id = (uintptr_t)makeSIMDExtract(this,(Type)this_local);
      }
      else {
        IVar2 = upTo(this,7);
        switch(IVar2) {
        case 0:
          Type::Type(&local_40,v128);
          type_local.id = (uintptr_t)makeUnary(this,local_40);
          break;
        case 1:
          Type::Type(&local_48,v128);
          type_local.id = (uintptr_t)makeBinary(this,local_48);
          break;
        case 2:
          type_local.id = (uintptr_t)makeSIMDReplace(this);
          break;
        case 3:
          type_local.id = (uintptr_t)makeSIMDShuffle(this);
          break;
        case 4:
          type_local.id = (uintptr_t)makeSIMDTernary(this);
          break;
        case 5:
          type_local.id = (uintptr_t)makeSIMDShift(this);
          break;
        case 6:
          type_local.id = (uintptr_t)makeSIMDLoad(this);
          break;
        default:
          ::wasm::handle_unreachable
                    ("invalid value",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,0x1190);
        }
      }
    }
    return (Expression *)type_local.id;
  }
  __assert_fail("wasm.features.hasSIMD()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1178,"Expression *wasm::TranslateToFuzzReader::makeSIMD(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMD(Type type) {
  assert(wasm.features.hasSIMD());
  if (type.isRef()) {
    return makeTrivial(type);
  }
  if (type != Type::v128) {
    return makeSIMDExtract(type);
  }
  // TODO: Add SIMDLoadStoreLane once it is generally available
  switch (upTo(7)) {
    case 0:
      return makeUnary(Type::v128);
    case 1:
      return makeBinary(Type::v128);
    case 2:
      return makeSIMDReplace();
    case 3:
      return makeSIMDShuffle();
    case 4:
      return makeSIMDTernary();
    case 5:
      return makeSIMDShift();
    case 6:
      return makeSIMDLoad();
  }
  WASM_UNREACHABLE("invalid value");
}